

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall llbuild::buildsystem::BuildSystem::build(BuildSystem *this,StringRef name)

{
  bool bVar1;
  BuildSystem *this_local;
  StringRef name_local;
  
  bVar1 = anon_unknown.dwarf_ecf33::BuildSystemImpl::build((BuildSystemImpl *)this->impl,name);
  return bVar1;
}

Assistant:

bool BuildSystem::build(StringRef name) {
  return static_cast<BuildSystemImpl*>(impl)->build(name);
}